

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_jh.c
# Opt level: O1

void F8(hashState *state)

{
  uint64 *puVar1;
  undefined4 uVar2;
  uint64 uVar3;
  ulong uVar4;
  ulong uVar5;
  uint64 (*pauVar6) [2];
  long lVar7;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  long lVar12;
  uchar (*pauVar13) [32];
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  ulong uVar22;
  ulong uVar23;
  bool bVar24;
  
  uVar4 = 0;
  do {
    puVar1 = state->x[0] + (uVar4 & 0xfffffffffffffffe) + (ulong)((uint)uVar4 & 1);
    *puVar1 = *puVar1 ^ *(ulong *)(state->buffer + uVar4 * 8);
    uVar4 = uVar4 + 1;
  } while (uVar4 != 8);
  lVar7 = 0x190d10;
  lVar12 = 0x190d30;
  pauVar13 = E8_bitslice_roundconstant;
  uVar4 = 0;
  do {
    lVar8 = 0;
    do {
      uVar14 = ~*(ulong *)(state->buffer + lVar8 * 8 + -0x20);
      uVar9 = state->x[4][lVar8];
      uVar18 = *(ulong *)(lVar7 + -0x10 + lVar8 * 8);
      uVar17 = *(ulong *)(lVar7 + lVar8 * 8);
      uVar23 = ~uVar9 & uVar18 ^ state->x[0][lVar8];
      uVar5 = *(ulong *)(state->buffer + lVar8 * 8 + -0x30);
      uVar10 = ~uVar5 & uVar17 ^ state->x[1][lVar8];
      uVar11 = ~*(ulong *)(state->buffer + lVar8 * 8 + -0x10);
      uVar15 = state->x[2][lVar8];
      uVar16 = state->x[3][lVar8];
      uVar18 = uVar15 & uVar23 ^ uVar18;
      uVar17 = uVar16 & uVar10 ^ uVar17;
      uVar23 = uVar9 & uVar14 ^ uVar23;
      uVar10 = uVar5 & uVar11 ^ uVar10;
      uVar20 = uVar23 & uVar9 ^ uVar15;
      uVar14 = uVar14 ^ ~uVar15 & uVar9;
      uVar9 = (~uVar15 & uVar9 ^ *(ulong *)(state->buffer + lVar8 * 8 + -0x20)) & uVar23 ^ uVar9;
      uVar15 = uVar10 & uVar5 ^ uVar16;
      uVar11 = uVar11 ^ ~uVar16 & uVar5;
      uVar5 = (~uVar16 & uVar5 ^ *(ulong *)(state->buffer + lVar8 * 8 + -0x10)) & uVar10 ^ uVar5;
      uVar21 = uVar9 & uVar20 ^ uVar14;
      uVar23 = (uVar14 | uVar20) ^ uVar23;
      uVar10 = (uVar11 | uVar15) ^ uVar10;
      uVar20 = uVar23 & uVar18 ^ uVar20;
      uVar9 = uVar9 ^ uVar18;
      uVar18 = uVar20 ^ uVar10;
      uVar16 = uVar15 ^ uVar9 ^ uVar10 & uVar17;
      uVar10 = uVar21 ^ uVar23 ^ uVar5 ^ uVar17;
      uVar17 = uVar5 & uVar15 ^ uVar11 ^ uVar23;
      state->x[0][lVar8] = uVar23 ^ uVar16;
      state->x[2][lVar8] = uVar20 ^ uVar10;
      state->x[4][lVar8] = uVar9 ^ uVar17 ^ uVar18;
      *(ulong *)(state->buffer + lVar8 * 8 + -0x20) = uVar18 ^ uVar21;
      state->x[1][lVar8] = uVar18 >> 1 & 0x5555555555555555 | uVar18 * 2 & 0xaaaaaaaaaaaaaaaa;
      state->x[3][lVar8] = uVar16 >> 1 & 0x5555555555555555 | uVar16 * 2 & 0xaaaaaaaaaaaaaaaa;
      *(ulong *)(state->buffer + lVar8 * 8 + -0x30) =
           uVar10 >> 1 & 0x5555555555555555 | uVar10 * 2 & 0xaaaaaaaaaaaaaaaa;
      *(ulong *)(state->buffer + lVar8 * 8 + -0x10) =
           uVar17 >> 1 & 0x5555555555555555 | uVar17 * 2 & 0xaaaaaaaaaaaaaaaa;
      lVar8 = lVar8 + 1;
    } while (lVar8 == 1);
    lVar8 = 0;
    do {
      uVar14 = ~*(ulong *)(state->buffer + lVar8 * 8 + -0x20);
      uVar9 = state->x[4][lVar8];
      uVar18 = *(ulong *)(lVar12 + -0x10 + lVar8 * 8);
      uVar17 = *(ulong *)(lVar12 + lVar8 * 8);
      uVar23 = ~uVar9 & uVar18 ^ state->x[0][lVar8];
      uVar5 = *(ulong *)(state->buffer + lVar8 * 8 + -0x30);
      uVar10 = ~uVar5 & uVar17 ^ state->x[1][lVar8];
      uVar11 = ~*(ulong *)(state->buffer + lVar8 * 8 + -0x10);
      uVar15 = state->x[2][lVar8];
      uVar16 = state->x[3][lVar8];
      uVar18 = uVar15 & uVar23 ^ uVar18;
      uVar17 = uVar16 & uVar10 ^ uVar17;
      uVar23 = uVar9 & uVar14 ^ uVar23;
      uVar10 = uVar5 & uVar11 ^ uVar10;
      uVar20 = uVar23 & uVar9 ^ uVar15;
      uVar14 = uVar14 ^ ~uVar15 & uVar9;
      uVar9 = (~uVar15 & uVar9 ^ *(ulong *)(state->buffer + lVar8 * 8 + -0x20)) & uVar23 ^ uVar9;
      uVar15 = uVar10 & uVar5 ^ uVar16;
      uVar11 = uVar11 ^ ~uVar16 & uVar5;
      uVar5 = (~uVar16 & uVar5 ^ *(ulong *)(state->buffer + lVar8 * 8 + -0x10)) & uVar10 ^ uVar5;
      uVar21 = uVar9 & uVar20 ^ uVar14;
      uVar23 = (uVar14 | uVar20) ^ uVar23;
      uVar10 = (uVar11 | uVar15) ^ uVar10;
      uVar20 = uVar23 & uVar18 ^ uVar20;
      uVar9 = uVar9 ^ uVar18;
      uVar18 = uVar20 ^ uVar10;
      uVar16 = uVar15 ^ uVar9 ^ uVar10 & uVar17;
      uVar10 = uVar21 ^ uVar23 ^ uVar5 ^ uVar17;
      uVar17 = uVar5 & uVar15 ^ uVar11 ^ uVar23;
      state->x[0][lVar8] = uVar23 ^ uVar16;
      state->x[2][lVar8] = uVar20 ^ uVar10;
      state->x[4][lVar8] = uVar9 ^ uVar17 ^ uVar18;
      *(ulong *)(state->buffer + lVar8 * 8 + -0x20) = uVar18 ^ uVar21;
      state->x[1][lVar8] = uVar18 >> 2 & 0x3333333333333333 | uVar18 * 4 & 0xcccccccccccccccc;
      state->x[3][lVar8] = uVar16 >> 2 & 0x3333333333333333 | uVar16 * 4 & 0xcccccccccccccccc;
      *(ulong *)(state->buffer + lVar8 * 8 + -0x30) =
           uVar10 >> 2 & 0x3333333333333333 | uVar10 * 4 & 0xcccccccccccccccc;
      *(ulong *)(state->buffer + lVar8 * 8 + -0x10) =
           uVar17 >> 2 & 0x3333333333333333 | uVar17 * 4 & 0xcccccccccccccccc;
      lVar8 = lVar8 + 1;
    } while (lVar8 == 1);
    lVar8 = 8;
    do {
      uVar9 = state->x[2][lVar8];
      uVar14 = ~uVar9;
      uVar18 = state->x[3][lVar8];
      uVar17 = state->x[0][lVar8];
      uVar23 = ~uVar17 & *(ulong *)(*pauVar13 + lVar8 * 8) ^
               *(ulong *)((long)(state->x + -4) + lVar8 * 8);
      uVar5 = state->x[1][lVar8];
      uVar10 = ~uVar5 & *(ulong *)(*pauVar13 + lVar8 * 8 + 0x10) ^
               *(ulong *)((long)(state->x + -3) + lVar8 * 8);
      uVar11 = ~uVar18;
      uVar15 = *(ulong *)(&((hashState *)(state->x + -2))->hashbitlen + lVar8 * 2);
      uVar16 = *(unsigned_long_long *)((long)(state->x + -1) + lVar8 * 8);
      uVar21 = uVar15 & uVar23 ^ *(ulong *)(*pauVar13 + lVar8 * 8);
      uVar19 = uVar16 & uVar10 ^ *(ulong *)(*pauVar13 + lVar8 * 8 + 0x10);
      uVar23 = uVar17 & uVar14 ^ uVar23;
      uVar10 = uVar5 & uVar11 ^ uVar10;
      uVar20 = uVar23 & uVar17 ^ uVar15;
      uVar14 = uVar14 ^ ~uVar15 & uVar17;
      uVar17 = (~uVar15 & uVar17 ^ uVar9) & uVar23 ^ uVar17;
      uVar15 = uVar10 & uVar5 ^ uVar16;
      uVar11 = uVar11 ^ ~uVar16 & uVar5;
      uVar5 = (~uVar16 & uVar5 ^ uVar18) & uVar10 ^ uVar5;
      uVar22 = uVar17 & uVar20 ^ uVar14;
      uVar23 = (uVar14 | uVar20) ^ uVar23;
      uVar10 = (uVar11 | uVar15) ^ uVar10;
      uVar20 = uVar23 & uVar21 ^ uVar20;
      uVar17 = uVar17 ^ uVar21;
      uVar9 = uVar20 ^ uVar10;
      uVar16 = uVar15 ^ uVar17 ^ uVar10 & uVar19;
      uVar10 = uVar22 ^ uVar23 ^ uVar5 ^ uVar19;
      uVar18 = uVar5 & uVar15 ^ uVar11 ^ uVar23;
      *(ulong *)((long)(state->x + -4) + lVar8 * 8) = uVar23 ^ uVar16;
      *(ulong *)(&((hashState *)(state->x + -2))->hashbitlen + lVar8 * 2) = uVar20 ^ uVar10;
      state->x[0][lVar8] = uVar17 ^ uVar18 ^ uVar9;
      state->x[2][lVar8] = uVar9 ^ uVar22;
      *(ulong *)((long)(state->x + -3) + lVar8 * 8) =
           uVar9 >> 4 & 0xf0f0f0f0f0f0f0f | (uVar9 & 0xf0f0f0f0f0f0f0f) << 4;
      *(ulong *)((long)(state->x + -1) + lVar8 * 8) =
           uVar16 >> 4 & 0xf0f0f0f0f0f0f0f | (uVar16 & 0xf0f0f0f0f0f0f0f) << 4;
      state->x[1][lVar8] = uVar10 >> 4 & 0xf0f0f0f0f0f0f0f | (uVar10 & 0xf0f0f0f0f0f0f0f) << 4;
      state->x[3][lVar8] = uVar18 >> 4 & 0xf0f0f0f0f0f0f0f | (uVar18 & 0xf0f0f0f0f0f0f0f) << 4;
      lVar8 = lVar8 + 1;
    } while (lVar8 == 9);
    lVar8 = 0xc;
    do {
      uVar9 = state->x[0][lVar8];
      uVar14 = ~uVar9;
      uVar18 = state->x[1][lVar8];
      uVar17 = *(ulong *)(&((hashState *)(state->x + -2))->hashbitlen + lVar8 * 2);
      uVar23 = ~uVar17 & *(ulong *)(*pauVar13 + lVar8 * 8) ^
               *(ulong *)((long)(state->x + -6) + lVar8 * 8);
      uVar5 = *(unsigned_long_long *)((long)(state->x + -1) + lVar8 * 8);
      uVar10 = ~uVar5 & *(ulong *)(*pauVar13 + lVar8 * 8 + 0x10) ^
               *(ulong *)((long)(state->x + -5) + lVar8 * 8);
      uVar11 = ~uVar18;
      uVar15 = *(ulong *)((long)(state->x + -4) + lVar8 * 8);
      uVar16 = *(ulong *)((long)(state->x + -3) + lVar8 * 8);
      uVar21 = uVar15 & uVar23 ^ *(ulong *)(*pauVar13 + lVar8 * 8);
      uVar19 = uVar16 & uVar10 ^ *(ulong *)(*pauVar13 + lVar8 * 8 + 0x10);
      uVar23 = uVar17 & uVar14 ^ uVar23;
      uVar10 = uVar5 & uVar11 ^ uVar10;
      uVar20 = uVar23 & uVar17 ^ uVar15;
      uVar14 = uVar14 ^ ~uVar15 & uVar17;
      uVar17 = (~uVar15 & uVar17 ^ uVar9) & uVar23 ^ uVar17;
      uVar15 = uVar10 & uVar5 ^ uVar16;
      uVar11 = uVar11 ^ ~uVar16 & uVar5;
      uVar5 = (~uVar16 & uVar5 ^ uVar18) & uVar10 ^ uVar5;
      uVar22 = uVar17 & uVar20 ^ uVar14;
      uVar23 = (uVar14 | uVar20) ^ uVar23;
      uVar10 = (uVar11 | uVar15) ^ uVar10;
      uVar20 = uVar23 & uVar21 ^ uVar20;
      uVar17 = uVar17 ^ uVar21;
      uVar9 = uVar20 ^ uVar10;
      uVar16 = uVar15 ^ uVar17 ^ uVar10 & uVar19;
      uVar10 = uVar22 ^ uVar23 ^ uVar5 ^ uVar19;
      uVar18 = uVar5 & uVar15 ^ uVar11 ^ uVar23;
      *(ulong *)((long)(state->x + -6) + lVar8 * 8) = uVar23 ^ uVar16;
      *(ulong *)((long)(state->x + -4) + lVar8 * 8) = uVar20 ^ uVar10;
      *(ulong *)(&((hashState *)(state->x + -2))->hashbitlen + lVar8 * 2) = uVar17 ^ uVar18 ^ uVar9;
      state->x[0][lVar8] = uVar9 ^ uVar22;
      *(ulong *)((long)(state->x + -5) + lVar8 * 8) =
           uVar9 >> 8 & 0xff00ff00ff00ff | (uVar9 & 0xff00ff00ff00ff) << 8;
      *(ulong *)((long)(state->x + -3) + lVar8 * 8) =
           uVar16 >> 8 & 0xff00ff00ff00ff | (uVar16 & 0xff00ff00ff00ff) << 8;
      *(ulong *)((long)(state->x + -1) + lVar8 * 8) =
           uVar10 >> 8 & 0xff00ff00ff00ff | (uVar10 & 0xff00ff00ff00ff) << 8;
      state->x[1][lVar8] = uVar18 >> 8 & 0xff00ff00ff00ff | (uVar18 & 0xff00ff00ff00ff) << 8;
      lVar8 = lVar8 + 1;
    } while (lVar8 == 0xd);
    lVar8 = 0x10;
    do {
      uVar9 = *(ulong *)(&((hashState *)(state->x + -2))->hashbitlen + lVar8 * 2);
      uVar20 = ~uVar9;
      uVar18 = *(ulong *)((long)(state->x + -4) + lVar8 * 8);
      uVar16 = ~uVar18 & *(ulong *)(*pauVar13 + lVar8 * 8) ^
               *(ulong *)((long)(state->x + -8) + lVar8 * 8);
      uVar17 = *(ulong *)((long)(state->x + -3) + lVar8 * 8);
      uVar23 = ~uVar17 & *(ulong *)(*pauVar13 + lVar8 * 8 + 0x10) ^
               *(ulong *)((long)(state->x + -7) + lVar8 * 8);
      uVar10 = ~*(unsigned_long_long *)((long)(state->x + -1) + lVar8 * 8);
      uVar5 = *(ulong *)((long)(state->x + -6) + lVar8 * 8);
      uVar15 = *(ulong *)((long)(state->x + -5) + lVar8 * 8);
      uVar14 = uVar5 & uVar16 ^ *(ulong *)(*pauVar13 + lVar8 * 8);
      uVar21 = uVar15 & uVar23 ^ *(ulong *)(*pauVar13 + lVar8 * 8 + 0x10);
      uVar16 = uVar18 & uVar20 ^ uVar16;
      uVar23 = uVar17 & uVar10 ^ uVar23;
      uVar11 = uVar16 & uVar18 ^ uVar5;
      uVar20 = uVar20 ^ ~uVar5 & uVar18;
      uVar18 = (~uVar5 & uVar18 ^ uVar9) & uVar16 ^ uVar18;
      uVar5 = uVar23 & uVar17 ^ uVar15;
      uVar10 = uVar10 ^ ~uVar15 & uVar17;
      uVar17 = (~uVar15 & uVar17 ^ *(unsigned_long_long *)((long)(state->x + -1) + lVar8 * 8)) &
               uVar23 ^ uVar17;
      uVar19 = uVar18 & uVar11 ^ uVar20;
      uVar16 = (uVar20 | uVar11) ^ uVar16;
      uVar23 = (uVar10 | uVar5) ^ uVar23;
      uVar11 = uVar16 & uVar14 ^ uVar11;
      uVar18 = uVar18 ^ uVar14;
      uVar9 = uVar11 ^ uVar23;
      uVar15 = uVar5 ^ uVar18 ^ uVar23 & uVar21;
      uVar23 = uVar19 ^ uVar16 ^ uVar17 ^ uVar21;
      uVar17 = uVar17 & uVar5 ^ uVar10 ^ uVar16;
      *(ulong *)((long)(state->x + -8) + lVar8 * 8) = uVar16 ^ uVar15;
      *(ulong *)((long)(state->x + -6) + lVar8 * 8) = uVar11 ^ uVar23;
      *(ulong *)((long)(state->x + -4) + lVar8 * 8) = uVar18 ^ uVar17 ^ uVar9;
      *(ulong *)(&((hashState *)(state->x + -2))->hashbitlen + lVar8 * 2) = uVar9 ^ uVar19;
      *(ulong *)((long)(state->x + -7) + lVar8 * 8) =
           uVar9 >> 0x10 & 0xffff0000ffff | (uVar9 & 0xffff0000ffff) << 0x10;
      *(ulong *)((long)(state->x + -5) + lVar8 * 8) =
           uVar15 >> 0x10 & 0xffff0000ffff | (uVar15 & 0xffff0000ffff) << 0x10;
      *(ulong *)((long)(state->x + -3) + lVar8 * 8) =
           uVar23 >> 0x10 & 0xffff0000ffff | (uVar23 & 0xffff0000ffff) << 0x10;
      *(ulong *)((long)(state->x + -1) + lVar8 * 8) =
           uVar17 >> 0x10 & 0xffff0000ffff | (uVar17 & 0xffff0000ffff) << 0x10;
      lVar8 = lVar8 + 1;
    } while (lVar8 == 0x11);
    lVar8 = 0x12;
    do {
      uVar9 = *(ulong *)((long)(state->x + -3) + lVar8 * 8);
      uVar14 = ~uVar9;
      uVar18 = *(ulong *)(&((hashState *)(state->x + -2))->hashbitlen + lVar8 * 2);
      uVar17 = *(ulong *)((long)(state->x + -5) + lVar8 * 8);
      uVar20 = ~uVar17 & *(ulong *)(*pauVar13 + lVar8 * 8 + 0x10) ^
               *(ulong *)((long)state + lVar8 * 8 + -0x70);
      uVar5 = *(ulong *)((long)(state->x + -4) + lVar8 * 8);
      uVar23 = ~uVar5 & *(ulong *)(pauVar13[1] + lVar8 * 8) ^
               *(ulong *)((long)(state->x + -8) + lVar8 * 8);
      uVar10 = ~uVar18;
      uVar15 = *(ulong *)((long)(state->x + -7) + lVar8 * 8);
      uVar16 = *(ulong *)((long)(state->x + -6) + lVar8 * 8);
      uVar19 = uVar15 & uVar20 ^ *(ulong *)(*pauVar13 + lVar8 * 8 + 0x10);
      uVar21 = uVar16 & uVar23 ^ *(ulong *)(pauVar13[1] + lVar8 * 8);
      uVar20 = uVar17 & uVar14 ^ uVar20;
      uVar23 = uVar5 & uVar10 ^ uVar23;
      uVar11 = uVar20 & uVar17 ^ uVar15;
      uVar14 = uVar14 ^ ~uVar15 & uVar17;
      uVar17 = (~uVar15 & uVar17 ^ uVar9) & uVar20 ^ uVar17;
      uVar15 = uVar23 & uVar5 ^ uVar16;
      uVar10 = uVar10 ^ ~uVar16 & uVar5;
      uVar5 = (~uVar16 & uVar5 ^ uVar18) & uVar23 ^ uVar5;
      uVar9 = uVar17 & uVar11 ^ uVar14;
      uVar20 = (uVar14 | uVar11) ^ uVar20;
      uVar23 = (uVar10 | uVar15) ^ uVar23;
      uVar11 = uVar20 & uVar19 ^ uVar11;
      uVar17 = uVar17 ^ uVar19;
      uVar14 = uVar11 ^ uVar23;
      uVar16 = uVar15 ^ uVar17 ^ uVar23 & uVar21;
      uVar18 = uVar9 ^ uVar20 ^ uVar5 ^ uVar21;
      uVar5 = uVar5 & uVar15 ^ uVar10 ^ uVar20;
      *(ulong *)((long)state + lVar8 * 8 + -0x70) = uVar20 ^ uVar16;
      *(ulong *)((long)(state->x + -7) + lVar8 * 8) = uVar11 ^ uVar18;
      *(ulong *)((long)(state->x + -5) + lVar8 * 8) = uVar17 ^ uVar5 ^ uVar14;
      *(ulong *)((long)(state->x + -3) + lVar8 * 8) = uVar14 ^ uVar9;
      *(ulong *)((long)(state->x + -8) + lVar8 * 8) = uVar14 << 0x20 | uVar14 >> 0x20;
      *(ulong *)((long)(state->x + -6) + lVar8 * 8) = uVar16 << 0x20 | uVar16 >> 0x20;
      *(ulong *)((long)(state->x + -4) + lVar8 * 8) = uVar18 << 0x20 | uVar18 >> 0x20;
      *(ulong *)(&((hashState *)(state->x + -2))->hashbitlen + lVar8 * 2) =
           uVar5 << 0x20 | uVar5 >> 0x20;
      lVar8 = lVar8 + 1;
    } while (lVar8 == 0x13);
    lVar8 = 0;
    do {
      uVar11 = ~*(ulong *)(state->buffer + lVar8 * 8 + -0x20);
      uVar9 = state->x[4][lVar8];
      uVar15 = ~uVar9 & *(ulong *)(pauVar13[6] + lVar8 * 8) ^ state->x[0][lVar8];
      uVar18 = *(ulong *)(state->buffer + lVar8 * 8 + -0x30);
      uVar16 = ~uVar18 & *(ulong *)(pauVar13[6] + lVar8 * 8 + 0x10) ^ state->x[1][lVar8];
      uVar23 = ~*(ulong *)(state->buffer + lVar8 * 8 + -0x10);
      uVar17 = state->x[2][lVar8];
      uVar5 = state->x[3][lVar8];
      uVar14 = uVar17 & uVar15 ^ *(ulong *)(pauVar13[6] + lVar8 * 8);
      uVar20 = uVar5 & uVar16 ^ *(ulong *)(pauVar13[6] + lVar8 * 8 + 0x10);
      uVar15 = uVar9 & uVar11 ^ uVar15;
      uVar16 = uVar18 & uVar23 ^ uVar16;
      uVar10 = uVar15 & uVar9 ^ uVar17;
      uVar11 = uVar11 ^ ~uVar17 & uVar9;
      uVar9 = (~uVar17 & uVar9 ^ *(ulong *)(state->buffer + lVar8 * 8 + -0x20)) & uVar15 ^ uVar9;
      uVar21 = uVar16 & uVar18 ^ uVar5;
      uVar23 = uVar23 ^ ~uVar5 & uVar18;
      uVar18 = (~uVar5 & uVar18 ^ *(ulong *)(state->buffer + lVar8 * 8 + -0x10)) & uVar16 ^ uVar18;
      uVar17 = uVar9 & uVar10 ^ uVar11;
      uVar15 = (uVar11 | uVar10) ^ uVar15;
      uVar16 = (uVar23 | uVar21) ^ uVar16;
      uVar10 = uVar15 & uVar14 ^ uVar10;
      uVar9 = uVar9 ^ uVar14;
      uVar11 = uVar10 ^ uVar16;
      uVar16 = uVar21 ^ uVar9 ^ uVar16 & uVar20;
      uVar5 = uVar17 ^ uVar15 ^ uVar18 ^ uVar20;
      state->x[1][lVar8] = uVar11;
      state->x[3][lVar8] = uVar16;
      uVar18 = uVar18 & uVar21 ^ uVar23 ^ uVar15;
      *(ulong *)(state->buffer + lVar8 * 8 + -0x30) = uVar5;
      *(ulong *)(state->buffer + lVar8 * 8 + -0x10) = uVar18;
      state->x[0][lVar8] = uVar16 ^ uVar15;
      state->x[2][lVar8] = uVar5 ^ uVar10;
      state->x[4][lVar8] = uVar18 ^ uVar9 ^ uVar11;
      *(ulong *)(state->buffer + lVar8 * 8 + -0x20) = uVar11 ^ uVar17;
      lVar8 = lVar8 + 1;
    } while (lVar8 == 1);
    uVar9 = 0xffffffffffffffff;
    pauVar6 = state->x + 1;
    do {
      uVar3 = (*pauVar6)[0];
      uVar2 = *(undefined4 *)((long)*pauVar6 + 4);
      *(int *)*pauVar6 = (int)(*pauVar6)[1];
      *(undefined4 *)((long)*pauVar6 + 4) = uVar2;
      *(int *)(*pauVar6 + 1) = (int)uVar3;
      *(undefined4 *)((long)*pauVar6 + 0xc) = uVar2;
      uVar9 = uVar9 + 2;
      pauVar6 = pauVar6 + 2;
    } while (uVar9 < 6);
    lVar7 = lVar7 + 0xe0;
    lVar12 = lVar12 + 0xe0;
    pauVar13 = pauVar13 + 7;
    bVar24 = uVar4 < 0x23;
    uVar4 = uVar4 + 7;
  } while (bVar24);
  uVar4 = 0;
  do {
    puVar1 = state->x[4] + (uVar4 & 0xfffffffffffffffe) + (ulong)((uint)uVar4 & 1);
    *puVar1 = *puVar1 ^ *(ulong *)(state->buffer + uVar4 * 8);
    uVar4 = uVar4 + 1;
  } while (uVar4 != 8);
  return;
}

Assistant:

static void F8(hashState *state)
{
      uint64  i;

      /*xor the 512-bit message with the fist half of the 1024-bit hash state*/
      for (i = 0; i < 8; i++)  state->x[i >> 1][i & 1] ^= ((uint64*)state->buffer)[i];

      /*the bijective function E8 */
      E8(state);

      /*xor the 512-bit message with the second half of the 1024-bit hash state*/
      for (i = 0; i < 8; i++)  state->x[(8+i) >> 1][(8+i) & 1] ^= ((uint64*)state->buffer)[i];
}